

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pGiaObj,Vec_Int_t *vRoAnds)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pGiaObj);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pGiaObj);
  if ((-1 < (int)(uint)*(undefined8 *)pGiaObj) &&
     (uVar2 = (uint)*(undefined8 *)pGiaObj & 0x1fffffff, uVar2 != 0x1fffffff)) {
    Gla_ManCollectInternal_rec(p,pGiaObj + -(ulong)uVar2,vRoAnds);
    Gla_ManCollectInternal_rec
              (p,pGiaObj + -(ulong)(*(uint *)&pGiaObj->field_0x4 & 0x1fffffff),vRoAnds);
    iVar1 = Gia_ObjId(p,pGiaObj);
    Vec_IntPush(vRoAnds,iVar1);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pGiaObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                ,0xe0,"void Gla_ManCollectInternal_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Gla_ManCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pGiaObj, Vec_Int_t * vRoAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pGiaObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pGiaObj);
    assert( Gia_ObjIsAnd(pGiaObj) );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin0(pGiaObj), vRoAnds );
    Gla_ManCollectInternal_rec( p, Gia_ObjFanin1(pGiaObj), vRoAnds );
    Vec_IntPush( vRoAnds, Gia_ObjId(p, pGiaObj) );
}